

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fiowfda(osfildef *fp,vocddef *p,uint cnt)

{
  uint16_t tmp;
  size_t sVar1;
  uint uVar2;
  uint *puVar3;
  uchar buf [14];
  
  puVar3 = &p->vocdtim;
  uVar2 = 0;
  do {
    if (cnt == uVar2) {
      buf[0] = 0xff;
      buf[1] = 0xff;
      sVar1 = fwrite(buf,0xd,1,(FILE *)fp);
      return (uint)(sVar1 != 1);
    }
    if (((vocddef *)(puVar3 + -7))->vocdfn != 0xffff) {
      buf._0_2_ = (undefined2)uVar2;
      buf[4] = ((runsdef *)(puVar3 + -5))->runstyp;
      if (((buf[4] == '\r') || (buf[4] == '\x02')) || (buf[4] == '\n')) {
        buf._5_2_ = ((anon_union_8_4_1dda36f5_for_runsv *)(puVar3 + -3))->runsvobj;
      }
      else if (buf[4] == '\x01') {
        buf._5_4_ = *(undefined4 *)(puVar3 + -3);
      }
      buf._9_2_ = *(undefined2 *)(puVar3 + -1);
      buf._11_2_ = *(undefined2 *)puVar3;
      buf._2_2_ = ((vocddef *)(puVar3 + -7))->vocdfn;
      sVar1 = fwrite(buf,0xd,1,(FILE *)fp);
      if (sVar1 != 1) {
        return 1;
      }
    }
    uVar2 = uVar2 + 1;
    puVar3 = puVar3 + 8;
  } while( true );
}

Assistant:

static int fiowfda(osfildef *fp, vocddef *p, uint cnt)
{
    uchar buf[14];
    uint  i;
    
    for (i = 0 ; i < cnt ; ++i, ++p)
    {
        if (p->vocdfn == MCMONINV) continue;            /* not set - ignore */
        
        oswp2(buf, i);                        /* element in array to be set */
        oswp2(buf+2, p->vocdfn);       /* object number for function/target */
        buf[4] = p->vocdarg.runstyp;                    /* type of argument */
        switch(buf[4])
        {
        case DAT_NUMBER:
            oswp4s(buf+5, p->vocdarg.runsv.runsvnum);
            break;
        case DAT_OBJECT:
        case DAT_FNADDR:
            oswp2(buf+5, p->vocdarg.runsv.runsvobj);
            break;
        case DAT_PROPNUM:
            oswp2(buf+5, p->vocdarg.runsv.runsvprp);
            break;
        }
        oswp2(buf+9, p->vocdprp);
        oswp2(buf+11, p->vocdtim);
        
        /* write this record to file */
        if (osfwb(fp, buf, 13)) return(TRUE);
    }
    
    /* write end record - -1 for array element number */
    oswp2(buf, 0xffff);
    return(osfwb(fp, buf, 13));
}